

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.hxx
# Opt level: O1

void __thiscall
args::ValueFlagList<int,_args::detail::vector,_args::ValueReader>::~ValueFlagList
          (ValueFlagList<int,_args::detail::vector,_args::ValueReader> *this)

{
  pointer piVar1;
  
  (this->super_ValueFlagBase).super_FlagBase.super_NamedBase.super_Base._vptr_Base =
       (_func_int **)&PTR__ValueFlagList_0021ef90;
  piVar1 = (this->defaultValues).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  piVar1 = (this->values).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar1 != (pointer)0x0) {
    operator_delete(piVar1);
  }
  FlagBase::~FlagBase((FlagBase *)this);
  return;
}

Assistant:

virtual ~ValueFlagList() {}